

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O0

int amqp_simple_wait_method
              (amqp_connection_state_t state,amqp_channel_t expected_channel,
              amqp_method_number_t expected_method,amqp_method_t *output)

{
  undefined8 *in_RCX;
  int in_EDX;
  short in_SI;
  int res;
  amqp_frame_t frame;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  char in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb1;
  short in_stack_ffffffffffffffb2;
  undefined4 in_stack_ffffffffffffffb4;
  int local_48;
  undefined4 uStack_44;
  undefined8 local_40;
  int local_4;
  
  local_4 = amqp_simple_wait_frame
                      ((amqp_connection_state_t)
                       CONCAT44(in_stack_ffffffffffffffb4,
                                CONCAT22(in_stack_ffffffffffffffb2,
                                         CONCAT11(in_stack_ffffffffffffffb1,
                                                  in_stack_ffffffffffffffb0))),
                       (amqp_frame_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
                      );
  if (local_4 == 0) {
    if (((in_stack_ffffffffffffffb2 == in_SI) && (in_stack_ffffffffffffffb0 == '\x01')) &&
       (local_48 == in_EDX)) {
      *in_RCX = CONCAT44(uStack_44,local_48);
      in_RCX[1] = local_40;
      local_4 = 0;
    }
    else {
      amqp_socket_close((amqp_socket_t *)0x113372);
      local_4 = -0xc;
    }
  }
  return local_4;
}

Assistant:

int amqp_simple_wait_method(amqp_connection_state_t state,
                            amqp_channel_t expected_channel,
                            amqp_method_number_t expected_method,
                            amqp_method_t *output)
{
  amqp_frame_t frame;
  int res = amqp_simple_wait_frame(state, &frame);
  if (AMQP_STATUS_OK != res) {
    return res;
  }

  if (frame.channel != expected_channel
      || frame.frame_type != AMQP_FRAME_METHOD
      || frame.payload.method.id != expected_method) {
    amqp_socket_close(state->socket);
    return AMQP_STATUS_WRONG_METHOD;
  }
  *output = frame.payload.method;
  return AMQP_STATUS_OK;
}